

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode pop3_statemach_act(connectdata *conn)

{
  anon_union_240_10_26c073a1_for_proto *pp;
  curl_socket_t sockfd;
  curl_usessl cVar1;
  int *piVar2;
  _Bool _Var3;
  CURLcode CVar4;
  uint uVar5;
  CURLcode CVar6;
  imapstate iVar7;
  curl_ftpfile cVar8;
  size_t sVar9;
  char *__dest;
  char *pcVar10;
  Curl_easy *pCVar11;
  size_t sVar12;
  size_t sVar13;
  size_t maxlen;
  pop3_conn *pop3c;
  byte *pbVar14;
  int pop3code;
  size_t nread;
  saslprogress local_50;
  undefined4 uStack_4c;
  uint local_44;
  SASL *local_40;
  size_t local_38;
  
  sockfd = conn->sock[0];
  local_38 = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    CVar4 = pop3_perform_upgrade_tls(conn);
    return CVar4;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar4 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar4;
  }
  local_40 = (SASL *)&(conn->proto).imapc.sasl.prefmech;
  do {
    CVar4 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,(int *)&local_44,&local_38);
    uVar5 = local_44;
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    if (local_44 == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      pCVar11 = conn->data;
      pcVar10 = (pCVar11->state).buffer;
      sVar9 = strlen(pcVar10);
      if (uVar5 != 0x2b) {
        Curl_failf(pCVar11,"Got unexpected pop3-server response");
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if (((3 < sVar9) && (3 < sVar9 - 2)) && (pcVar10[sVar9 - 2] == '>')) {
        pcVar10 = pcVar10 + 3;
        do {
          if (*pcVar10 == '<') {
            if (sVar9 != 4) {
              __dest = (char *)(*Curl_ccalloc)(1,sVar9 - 3);
              (conn->proto).imapc.mailbox_uidvalidity = __dest;
              if (__dest != (char *)0x0) {
                memcpy(__dest,pcVar10,sVar9 - 4);
                (conn->proto).imapc.mailbox_uidvalidity[sVar9 - 4] = '\0';
                pbVar14 = (byte *)((long)&conn->proto + 0xa8);
                *pbVar14 = *pbVar14 | 2;
              }
            }
            break;
          }
          pcVar10 = pcVar10 + 1;
          sVar9 = sVar9 - 1;
        } while (sVar9 != 5);
      }
      (conn->proto).ftpc.cwdcount = 0;
      (conn->proto).imapc.cmdid = 0;
      (conn->proto).pop3c.tls_supported = false;
      CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","CAPA");
      iVar7 = IMAP_CAPABILITY;
      goto joined_r0x001332c1;
    case IMAP_CAPABILITY:
      pCVar11 = conn->data;
      piVar2 = (int *)(pCVar11->state).buffer;
      sVar9 = strlen((char *)piVar2);
      if (uVar5 == 0x2b) {
        cVar1 = (pCVar11->set).use_ssl;
        if ((cVar1 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
          if ((conn->proto).pop3c.tls_supported == true) {
            CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","STLS");
            iVar7 = IMAP_STARTTLS;
            goto joined_r0x001332c1;
          }
          if (cVar1 != CURLUSESSL_TRY) {
            pcVar10 = "STLS not supported.";
            goto LAB_00133484;
          }
        }
LAB_001333c2:
        CVar6 = pop3_perform_authentication(conn);
        break;
      }
      if (uVar5 != 0x2a) {
        pbVar14 = (byte *)((long)&conn->proto + 0xa8);
        *pbVar14 = *pbVar14 | 1;
        goto LAB_001333c2;
      }
      if (3 < sVar9) {
        if (*piVar2 == 0x534c5453) {
          (conn->proto).pop3c.tls_supported = true;
        }
        else if (*piVar2 == 0x52455355) {
          pbVar14 = (byte *)((long)&conn->proto + 0xa8);
          *pbVar14 = *pbVar14 | 1;
        }
        else if ((sVar9 != 4) && ((char)piVar2[1] == ' ' && *piVar2 == 0x4c534153)) {
          pbVar14 = (byte *)((long)&conn->proto + 0xa8);
          *pbVar14 = *pbVar14 | 4;
          sVar12 = sVar9 - 5;
          if (sVar12 != 0) {
            pbVar14 = (byte *)((long)piVar2 + 5);
            do {
              while ((0x20 < (ulong)*pbVar14 ||
                     ((0x100002600U >> ((ulong)*pbVar14 & 0x3f) & 1) == 0))) {
                sVar13 = 0;
                do {
                  if (((ulong)pbVar14[sVar13] < 0x21) &&
                     (maxlen = sVar13, (0x100002600U >> ((ulong)pbVar14[sVar13] & 0x3f) & 1) != 0))
                  break;
                  sVar13 = sVar13 + 1;
                  maxlen = sVar12;
                } while (sVar12 != sVar13);
                uVar5 = Curl_sasl_decode_mech((char *)pbVar14,maxlen,(size_t *)&local_50);
                if ((uVar5 != 0) && (CONCAT44(uStack_4c,local_50) == maxlen)) {
                  piVar2 = &(conn->proto).ftpc.cwdcount;
                  *piVar2 = *piVar2 | uVar5;
                }
                pbVar14 = pbVar14 + maxlen;
                sVar12 = sVar12 - maxlen;
                if (sVar12 == 0) goto LAB_001333d3;
              }
              pbVar14 = pbVar14 + 1;
              sVar12 = sVar12 - 1;
            } while (sVar12 != 0);
          }
        }
      }
      goto LAB_001333d3;
    case IMAP_STARTTLS:
      if (local_44 == 0x2b) {
        CVar6 = pop3_perform_upgrade_tls(conn);
      }
      else {
        pCVar11 = conn->data;
        if ((pCVar11->set).use_ssl != CURLUSESSL_TRY) {
          pcVar10 = "STARTTLS denied";
LAB_00133484:
          Curl_failf(pCVar11,pcVar10);
          return CURLE_USE_SSL_FAILED;
        }
        CVar6 = pop3_perform_authentication(conn);
      }
      break;
    default:
switchD_00132f98_caseD_4:
      (conn->proto).imapc.state = IMAP_STOP;
      return CURLE_OK;
    case IMAP_AUTHENTICATE:
      pCVar11 = conn->data;
      CVar6 = Curl_sasl_continue(local_40,conn,local_44,&local_50);
      if (CVar6 == CURLE_OK) {
        if (local_50 == SASL_IDLE) {
          cVar8 = (conn->proto).pop3c.preftype & (conn->proto).ftpc.prevmethod;
          if ((cVar8 & FTPFILE_NOCWD) == 0) {
            if ((cVar8 & FTPFILE_MULTICWD) == 0) {
              Curl_failf(pCVar11,"Authentication cancelled");
              CVar6 = CURLE_LOGIN_DENIED;
            }
            else {
              CVar6 = pop3_perform_user(conn);
            }
          }
          else {
            CVar6 = pop3_perform_apop(conn);
          }
        }
        else {
          CVar6 = CURLE_OK;
          CVar4 = CURLE_OK;
          if (local_50 == SASL_DONE) goto LAB_00133243;
        }
      }
      break;
    case IMAP_LOGIN:
      if (local_44 == 0x2b) goto switchD_00132f98_caseD_4;
      pCVar11 = conn->data;
      pcVar10 = "Authentication failed: %d";
      goto LAB_0013346b;
    case IMAP_LIST:
      if (local_44 != 0x2b) goto LAB_00133415;
      pcVar10 = conn->passwd;
      if (pcVar10 == (char *)0x0) {
        pcVar10 = "";
      }
      CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"PASS %s",pcVar10);
      iVar7 = IMAP_SELECT;
joined_r0x001332c1:
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      (conn->proto).imapc.state = iVar7;
      goto LAB_001333dc;
    case IMAP_SELECT:
      if (local_44 == 0x2b) goto switchD_00132f98_caseD_4;
LAB_00133415:
      pCVar11 = conn->data;
      pcVar10 = "Access denied. %c";
LAB_0013346b:
      Curl_failf(pCVar11,pcVar10,(ulong)local_44);
      return CURLE_LOGIN_DENIED;
    case IMAP_FETCH:
      CVar4 = CURLE_RECV_ERROR;
      if (local_44 == 0x2b) {
        pCVar11 = conn->data;
        piVar2 = (int *)(pCVar11->req).protop;
        (conn->proto).pop3c.eob = 2;
        (conn->proto).pop3c.strip = 2;
        CVar4 = CURLE_OK;
        if (*piVar2 == 0) {
          Curl_setup_transfer(conn,0,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
          pcVar10 = (conn->proto).ftpc.pp.cache;
          CVar4 = CURLE_OK;
          if (pcVar10 != (char *)0x0) {
            if ((pCVar11->set).opt_no_body == false) {
              CVar6 = Curl_pop3_write(conn,pcVar10,(conn->proto).rtspc.rtp_bufsize);
              if (CVar6 != CURLE_OK) {
                return CVar6;
              }
              pcVar10 = (pp->ftpc).pp.cache;
            }
            (*Curl_cfree)(pcVar10);
            (pp->ftpc).pp.cache = (char *)0x0;
            (conn->proto).ftpc.pp.cache_size = 0;
          }
        }
      }
LAB_00133243:
      CVar6 = CVar4;
      (conn->proto).imapc.state = IMAP_STOP;
    }
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
LAB_001333d3:
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
LAB_001333dc:
    _Var3 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var3) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode pop3_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int pop3code;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not POP3 */
  if(pop3c->state == POP3_UPGRADETLS)
    return pop3_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

 do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &pop3code, &nread);
    if(result)
      return result;

    if(!pop3code)
      break;

    /* We have now received a full POP3 server response */
    switch(pop3c->state) {
    case POP3_SERVERGREET:
      result = pop3_state_servergreet_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_CAPA:
      result = pop3_state_capa_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_STARTTLS:
      result = pop3_state_starttls_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH:
      result = pop3_state_auth_resp(conn, pop3code, pop3c->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case POP3_APOP:
      result = pop3_state_apop_resp(conn, pop3code, pop3c->state);
      break;
#endif

    case POP3_USER:
      result = pop3_state_user_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_PASS:
      result = pop3_state_pass_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_COMMAND:
      result = pop3_state_command_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, POP3_STOP);
      break;
    }
  } while(!result && pop3c->state != POP3_STOP && Curl_pp_moredata(pp));

  return result;
}